

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

PClassActor * __thiscall PClassActor::GetReplacement(PClassActor *this,bool lookskill)

{
  undefined1 auVar1 [4];
  PClass *pPVar2;
  PClassActor *pPVar3;
  undefined7 in_register_00000031;
  undefined1 auVar4 [4];
  long lVar5;
  PClassActor *pPVar6;
  undefined1 local_4c [4];
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  FName local_38;
  int local_34;
  
  auVar4 = (undefined1  [4])0;
  if (((int)CONCAT71(in_register_00000031,lookskill) != 0) &&
     (auVar4 = (undefined1  [4])0, (uint)gameskill.Value < AllSkills.Count)) {
    local_34 = (this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
    FSkillInfo::GetReplacement((FSkillInfo *)local_4c,&AllSkills.Array[gameskill.Value].Name);
    auVar1 = local_4c;
    lVar5 = (long)(int)local_4c;
    if (lVar5 != 0) {
      local_38.Index = (int)local_4c;
      pPVar2 = PClass::FindClass(&local_38);
      auVar4 = auVar1;
      if (pPVar2 == (PClass *)0x0) {
        Printf("Warning: incorrect actor name in definition of skill %s: \nclass %s is replaced by non-existent class %s\nSkill replacement will be ignored for this actor.\n"
               ,FName::NameData.NameArray[AllSkills.Array[gameskill.Value].Name.Index].Text,
               FName::NameData.NameArray
               [(this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text,
               FName::NameData.NameArray[lVar5].Text);
        local_3c.Index = (this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
        local_40.Index = 0;
        FSkillInfo::SetReplacement(AllSkills.Array + gameskill.Value,&local_3c,&local_40);
        local_44.Index = (int)auVar1;
        local_48.Index = 0;
        FSkillInfo::SetReplacedBy(AllSkills.Array + gameskill.Value,&local_44,&local_48);
        pPVar3 = this->Replacement;
        if (pPVar3 == (PClassActor *)0x0) {
          return this;
        }
        this->Replacement = (PClassActor *)0x0;
        pPVar6 = pPVar3;
        goto LAB_004ee406;
      }
    }
  }
  pPVar6 = this->Replacement;
  if (pPVar6 == (PClassActor *)0x0) {
    if (!lookskill || auVar4 == (undefined1  [4])0x0) {
      return this;
    }
    this->Replacement = (PClassActor *)0x0;
  }
  else {
    this->Replacement = (PClassActor *)0x0;
    pPVar3 = pPVar6;
    if (!lookskill || auVar4 == (undefined1  [4])0x0) goto LAB_004ee406;
  }
  local_4c = auVar4;
  pPVar2 = PClass::FindClass((FName *)local_4c);
  pPVar3 = dyn_cast<PClassActor>((DObject *)pPVar2);
LAB_004ee406:
  pPVar3 = GetReplacement(pPVar3,false);
  this->Replacement = pPVar6;
  return pPVar3;
}

Assistant:

PClassActor *PClassActor::GetReplacement(bool lookskill)
{
	FName skillrepname;
	
	if (lookskill && AllSkills.Size() > (unsigned)gameskill)
	{
		skillrepname = AllSkills[gameskill].GetReplacement(TypeName);
		if (skillrepname != NAME_None && PClass::FindClass(skillrepname) == NULL)
		{
			Printf("Warning: incorrect actor name in definition of skill %s: \n"
				   "class %s is replaced by non-existent class %s\n"
				   "Skill replacement will be ignored for this actor.\n", 
				   AllSkills[gameskill].Name.GetChars(), 
				   TypeName.GetChars(), skillrepname.GetChars());
			AllSkills[gameskill].SetReplacement(TypeName, NAME_None);
			AllSkills[gameskill].SetReplacedBy(skillrepname, NAME_None);
			lookskill = false; skillrepname = NAME_None;
		}
	}
	if (Replacement == NULL && (!lookskill || skillrepname == NAME_None))
	{
		return this;
	}
	// The Replacement field is temporarily NULLed to prevent
	// potential infinite recursion.
	PClassActor *savedrep = Replacement;
	Replacement = NULL;
	PClassActor *rep = savedrep;
	// Handle skill-based replacement here. It has precedence on DECORATE replacement
	// in that the skill replacement is applied first, followed by DECORATE replacement
	// on the actor indicated by the skill replacement.
	if (lookskill && (skillrepname != NAME_None))
	{
		rep = PClass::FindActor(skillrepname);
	}
	// Now handle DECORATE replacement chain
	// Skill replacements are not recursive, contrarily to DECORATE replacements
	rep = rep->GetReplacement(false);
	// Reset the temporarily NULLed field
	Replacement = savedrep;
	return rep;
}